

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

ch_closure * ch_loadclosure(ch_function *function,uint8_t upvalue_count)

{
  uint8_t i;
  ch_upvalue **ppcVar1;
  ulong uVar2;
  ch_closure *pcVar3;
  undefined3 in_register_00000031;
  
  ppcVar1 = (ch_upvalue **)malloc((ulong)(CONCAT31(in_register_00000031,upvalue_count) * 8));
  for (uVar2 = 0; CONCAT31(in_register_00000031,upvalue_count) != uVar2; uVar2 = uVar2 + 1) {
    ppcVar1[uVar2] = (ch_upvalue *)0x0;
  }
  pcVar3 = (ch_closure *)malloc(0x20);
  pcVar3->function = function;
  (pcVar3->object).type = TYPE_CLOSURE;
  pcVar3->upvalues = ppcVar1;
  pcVar3->upvalue_count = upvalue_count;
  return pcVar3;
}

Assistant:

ch_closure *ch_loadclosure(ch_function* function, uint8_t upvalue_count) {
  ch_upvalue** upvalues = malloc(sizeof(ch_upvalue*) * upvalue_count);
  for(uint8_t i = 0; i < upvalue_count; i++) {
    upvalues[i] = NULL;
  }

  ch_closure *closure = malloc(sizeof(ch_closure));
  closure->function = function;
  closure->object.type = TYPE_CLOSURE;
  closure->upvalues = upvalues;
  closure->upvalue_count = upvalue_count;

  return closure;
}